

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O3

void google::protobuf::StrAppend(string *result,AlphaNum *a,AlphaNum *b,AlphaNum *c)

{
  LogMessage *pLVar1;
  pointer pcVar2;
  size_type sVar3;
  pointer __dest;
  LogFinisher local_69;
  LogMessage local_68;
  
  pcVar2 = (result->_M_dataplus)._M_p;
  sVar3 = result->_M_string_length;
  if ((ulong)((long)a->piece_data_ - (long)pcVar2) <= sVar3) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x636);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: (uintptr_t((a).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_69,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
    pcVar2 = (result->_M_dataplus)._M_p;
    sVar3 = result->_M_string_length;
  }
  if ((ulong)((long)b->piece_data_ - (long)pcVar2) <= sVar3) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x637);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: (uintptr_t((b).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_69,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
    pcVar2 = (result->_M_dataplus)._M_p;
    sVar3 = result->_M_string_length;
  }
  if ((ulong)((long)c->piece_data_ - (long)pcVar2) <= sVar3) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x638);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: (uintptr_t((c).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=(&local_69,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
    sVar3 = result->_M_string_length;
  }
  std::__cxx11::string::resize
            ((ulong)result,
             (char)a->piece_size_ + (char)sVar3 + (char)b->piece_size_ + (char)c->piece_size_);
  pcVar2 = (result->_M_dataplus)._M_p;
  __dest = pcVar2 + sVar3;
  if (a->piece_size_ != 0) {
    memcpy(__dest,a->piece_data_,a->piece_size_);
    __dest = __dest + a->piece_size_;
  }
  if (b->piece_size_ != 0) {
    memcpy(__dest,b->piece_data_,b->piece_size_);
    __dest = __dest + b->piece_size_;
  }
  if (c->piece_size_ != 0) {
    memcpy(__dest,c->piece_data_,c->piece_size_);
    __dest = __dest + c->piece_size_;
  }
  if (__dest != pcVar2 + result->_M_string_length) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x63e);
    pLVar1 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (out) == (begin + result->size()): ");
    internal::LogFinisher::operator=(&local_69,pLVar1);
    internal::LogMessage::~LogMessage(&local_68);
  }
  return;
}

Assistant:

void StrAppend(std::string *result, const AlphaNum &a, const AlphaNum &b,
               const AlphaNum &c) {
  GOOGLE_DCHECK_NO_OVERLAP(*result, a);
  GOOGLE_DCHECK_NO_OVERLAP(*result, b);
  GOOGLE_DCHECK_NO_OVERLAP(*result, c);
  std::string::size_type old_size = result->size();
  result->resize(old_size + a.size() + b.size() + c.size());
  char *const begin = &*result->begin();
  char *out = Append2(begin + old_size, a, b);
  out = Append1(out, c);
  GOOGLE_DCHECK_EQ(out, begin + result->size());
}